

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O3

int session_send_disposition(LINK_ENDPOINT_HANDLE link_endpoint,DISPOSITION_HANDLE disposition)

{
  int iVar1;
  AMQP_VALUE performative;
  int iVar2;
  
  iVar2 = 0x560;
  if (disposition != (DISPOSITION_HANDLE)0x0 && link_endpoint != (LINK_ENDPOINT_HANDLE)0x0) {
    performative = amqpvalue_create_disposition(disposition);
    if (performative == (AMQP_VALUE)0x0) {
      iVar2 = 0x567;
    }
    else {
      iVar1 = connection_encode_frame
                        (link_endpoint->session->endpoint,performative,(PAYLOAD *)0x0,0,
                         (ON_SEND_COMPLETE)0x0,(void *)0x0);
      iVar2 = 0x56d;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
      amqpvalue_destroy(performative);
    }
  }
  return iVar2;
}

Assistant:

int session_send_disposition(LINK_ENDPOINT_HANDLE link_endpoint, DISPOSITION_HANDLE disposition)
{
    int result;

    if ((link_endpoint == NULL) ||
        (disposition == NULL))
    {
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE disposition_performative_value = amqpvalue_create_disposition(disposition);
        if (disposition_performative_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (encode_frame(link_endpoint, disposition_performative_value, NULL, 0) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(disposition_performative_value);
        }
    }

    return result;
}